

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLGeometryLoader.cpp
# Opt level: O2

bool __thiscall COLLADASaxFWL::GeometryLoader::begin__mesh(GeometryLoader *this)

{
  COLLADAVersion CVar1;
  MeshLoader *this_00;
  MeshLoader14 *this_01;
  long lStack_20;
  
  this_00 = (MeshLoader *)operator_new(0x270);
  MeshLoader::MeshLoader(this_00,(IFilePartLoader *)this,&this->mGeometryId,&this->mGeometryName);
  this->mMeshLoader = this_00;
  (this->super_FilePartLoader).super_IFilePartLoader.mPartLoader = (IFilePartLoader *)this_00;
  CVar1 = ((this->super_FilePartLoader).super_IFilePartLoader.mParserImpl)->mCOLLADAVersion;
  if (CVar1 == COLLADA_14) {
    this_01 = (MeshLoader14 *)operator_new(0x28);
    MeshLoader14::MeshLoader14(this_01,this_00);
    lStack_20 = 0x48;
  }
  else {
    if (CVar1 != COLLADA_15) {
      return true;
    }
    this_01 = (MeshLoader14 *)operator_new(0x28);
    MeshLoader15::MeshLoader15((MeshLoader15 *)this_01,this_00);
    lStack_20 = 0x50;
  }
  (this->mMeshLoader->super_SourceArrayLoader).super_FilePartLoader.super_IFilePartLoader.
  mParserImpl = (IParserImpl *)this_01;
  (**(code **)((long)(this->super_FilePartLoader).super_IFilePartLoader.super_ExtraDataLoader.
                     _vptr_ExtraDataLoader + lStack_20))
            (this,&(this_01->super_SourceArrayLoader14).super_IParserImpl14.
                   super_ColladaParserAutoGen14);
  return true;
}

Assistant:

bool GeometryLoader::begin__mesh()
	{
        mMeshLoader = new MeshLoader(this, mGeometryId, mGeometryName);
        setPartLoader(mMeshLoader);
        switch (this->getParserImpl()->getCOLLADAVersion())
        {
        case COLLADA_14:
            {
            MeshLoader14* meshloader14 = new MeshLoader14( mMeshLoader );
            mMeshLoader->setParserImpl(meshloader14);
            setParser(meshloader14);
            break;
            }
        case COLLADA_15:
            {
            MeshLoader15* meshloader15 = new MeshLoader15( mMeshLoader );
            mMeshLoader->setParserImpl(meshloader15);
            setParser(meshloader15);
            break;
            }
        default:
            break;
        }
		return true;
	}